

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

char_t * pugi::impl::anon_unknown_0::strconv_escape(char_t *s,gap *g)

{
  char_t *pcVar1;
  byte bVar2;
  char_t *pcVar3;
  bool bVar4;
  char cVar5;
  uint uVar6;
  value_type puVar7;
  uint ch;
  long lVar8;
  char *pcVar9;
  
  pcVar1 = s + 1;
  bVar2 = s[1];
  if (0x66 < bVar2) {
    if (bVar2 == 0x67) {
      if (s[2] != 't') goto LAB_0011fc4d;
      if (s[3] != ';') goto LAB_0011fcc4;
      *s = '>';
    }
    else {
      if (bVar2 != 0x6c) {
        if (bVar2 != 0x71) {
          return pcVar1;
        }
        if (s[2] != 'u') {
LAB_0011fc4d:
          return s + 2;
        }
        if (s[3] != 'o') goto LAB_0011fcc4;
        if (s[4] != 't') goto LAB_0011fcf8;
        if (s[5] != ';') goto LAB_0011fd39;
        *s = '\"';
        goto LAB_0011fc97;
      }
      if (s[2] != 't') goto LAB_0011fc4d;
      if (s[3] != ';') goto LAB_0011fcc4;
      *s = '<';
    }
    pcVar3 = g->end;
    if (pcVar3 != (char_t *)0x0) {
      memmove(pcVar3 + -g->size,pcVar3,(long)pcVar1 - (long)pcVar3);
    }
    pcVar9 = s + 4;
    puVar7 = (value_type)(s + 4);
    lVar8 = 3;
    goto LAB_0011fdb4;
  }
  if (bVar2 != 0x23) {
    if (bVar2 != 0x61) {
      return pcVar1;
    }
    if (s[2] != 'p') {
      if (s[2] != 'm') goto LAB_0011fc4d;
      if (s[3] != 'p') goto LAB_0011fcc4;
      if (s[4] != ';') goto LAB_0011fcf8;
      *s = '&';
      pcVar3 = g->end;
      if (pcVar3 != (char_t *)0x0) {
        memmove(pcVar3 + -g->size,pcVar3,(long)pcVar1 - (long)pcVar3);
      }
      pcVar9 = s + 5;
      puVar7 = (value_type)(s + 5);
      lVar8 = 4;
      goto LAB_0011fdb4;
    }
    if (s[3] != 'o') {
LAB_0011fcc4:
      return s + 3;
    }
    if (s[4] != 's') {
LAB_0011fcf8:
      return s + 4;
    }
    if (s[5] != ';') {
LAB_0011fd39:
      return s + 5;
    }
    *s = '\'';
LAB_0011fc97:
    pcVar3 = g->end;
    if (pcVar3 != (char_t *)0x0) {
      memmove(pcVar3 + -g->size,pcVar3,(long)pcVar1 - (long)pcVar3);
    }
    pcVar9 = s + 6;
    puVar7 = (value_type)(s + 6);
    lVar8 = 5;
    goto LAB_0011fdb4;
  }
  pcVar9 = s + 2;
  cVar5 = s[2];
  if (cVar5 != ';') {
    if (cVar5 != 'x') {
      uVar6 = (int)cVar5 - 0x30;
      ch = 0;
      if (uVar6 < 10) {
        ch = 0;
        do {
          ch = uVar6 + ch * 10;
          cVar5 = pcVar9[1];
          pcVar9 = pcVar9 + 1;
          uVar6 = (int)cVar5 - 0x30;
        } while (uVar6 < 10);
      }
      if (cVar5 == ';') {
        pcVar9 = pcVar9 + 1;
        goto LAB_0011fd35;
      }
      goto LAB_0011fd45;
    }
    cVar5 = s[3];
    if (cVar5 != ';') {
      pcVar9 = s + 4;
      ch = 0;
      do {
        uVar6 = (int)cVar5 - 0x30;
        if (uVar6 < 10) {
          ch = ch << 4 | uVar6;
        }
        else {
          uVar6 = (int)cVar5 | 0x20;
          if (5 < uVar6 - 0x61) goto LAB_0011fd31;
          ch = (ch * 0x10 + uVar6) - 0x57;
        }
        cVar5 = *pcVar9;
        pcVar9 = pcVar9 + 1;
      } while( true );
    }
    pcVar9 = s + 3;
  }
  ch = 0;
LAB_0011fd45:
  bVar4 = false;
  goto LAB_0011fd47;
LAB_0011fd31:
  if (cVar5 != ';') {
    pcVar9 = pcVar9 + -1;
    goto LAB_0011fd45;
  }
LAB_0011fd35:
  bVar4 = true;
LAB_0011fd47:
  if (!bVar4) {
    return pcVar9;
  }
  if (ch < 0x10000) {
    puVar7 = utf8_writer::low((value_type)s,ch);
  }
  else {
    *s = (byte)(ch >> 0x12) | 0xf0;
    s[1] = (byte)(ch >> 0xc) & 0x3f | 0x80;
    s[2] = (byte)(ch >> 6) & 0x3f | 0x80;
    s[3] = (byte)ch & 0x3f | 0x80;
    puVar7 = (value_type)(s + 4);
  }
  lVar8 = (long)pcVar9 - (long)puVar7;
  pcVar1 = g->end;
  if (pcVar1 != (char_t *)0x0) {
    memmove(pcVar1 + -g->size,pcVar1,(long)puVar7 - (long)pcVar1);
  }
  puVar7 = puVar7 + lVar8;
LAB_0011fdb4:
  g->end = (char_t *)puVar7;
  g->size = g->size + lVar8;
  return pcVar9;
}

Assistant:

PUGI__FN char_t* strconv_escape(char_t* s, gap& g)
	{
		char_t* stre = s + 1;

		switch (*stre)
		{
			case '#':	// &#...
			{
				unsigned int ucsc = 0;

				if (stre[1] == 'x') // &#x... (hex code)
				{
					stre += 2;

					char_t ch = *stre;

					if (ch == ';') return stre;

					for (;;)
					{
						if (static_cast<unsigned int>(ch - '0') <= 9)
							ucsc = 16 * ucsc + (ch - '0');
						else if (static_cast<unsigned int>((ch | ' ') - 'a') <= 5)
							ucsc = 16 * ucsc + ((ch | ' ') - 'a' + 10);
						else if (ch == ';')
							break;
						else // cancel
							return stre;

						ch = *++stre;
					}

					++stre;
				}
				else	// &#... (dec code)
				{
					char_t ch = *++stre;

					if (ch == ';') return stre;

					for (;;)
					{
						if (static_cast<unsigned int>(ch - '0') <= 9)
							ucsc = 10 * ucsc + (ch - '0');
						else if (ch == ';')
							break;
						else // cancel
							return stre;

						ch = *++stre;
					}

					++stre;
				}

			#ifdef PUGIXML_WCHAR_MODE
				s = reinterpret_cast<char_t*>(wchar_writer::any(reinterpret_cast<wchar_writer::value_type>(s), ucsc));
			#else
				s = reinterpret_cast<char_t*>(utf8_writer::any(reinterpret_cast<uint8_t*>(s), ucsc));
			#endif

				g.push(s, stre - s);
				return stre;
			}

			case 'a':	// &a
			{
				++stre;

				if (*stre == 'm') // &am
				{
					if (*++stre == 'p' && *++stre == ';') // &amp;
					{
						*s++ = '&';
						++stre;

						g.push(s, stre - s);
						return stre;
					}
				}
				else if (*stre == 'p') // &ap
				{
					if (*++stre == 'o' && *++stre == 's' && *++stre == ';') // &apos;
					{
						*s++ = '\'';
						++stre;

						g.push(s, stre - s);
						return stre;
					}
				}
				break;
			}

			case 'g': // &g
			{
				if (*++stre == 't' && *++stre == ';') // &gt;
				{
					*s++ = '>';
					++stre;

					g.push(s, stre - s);
					return stre;
				}
				break;
			}

			case 'l': // &l
			{
				if (*++stre == 't' && *++stre == ';') // &lt;
				{
					*s++ = '<';
					++stre;

					g.push(s, stre - s);
					return stre;
				}
				break;
			}

			case 'q': // &q
			{
				if (*++stre == 'u' && *++stre == 'o' && *++stre == 't' && *++stre == ';') // &quot;
				{
					*s++ = '"';
					++stre;

					g.push(s, stre - s);
					return stre;
				}
				break;
			}

			default:
				break;
		}

		return stre;
	}